

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O0

wchar_t pick_chest_traps(object *obj)

{
  uint32_t uVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t local_20;
  wchar_t trap;
  wchar_t level;
  object *obj_local;
  
  wVar3 = obj->kind->level;
  uVar1 = Rand_div(10);
  if (uVar1 == 0) {
    obj_local._4_4_ = L'\x01';
  }
  else {
    local_20 = pick_one_chest_trap(wVar3);
    if ((L'\x05' < wVar3) && (uVar1 = Rand_div((0x41 - wVar3) / 10 + 1), uVar1 == 0)) {
      wVar2 = pick_one_chest_trap(wVar3);
      local_20 = wVar2 | local_20;
    }
    if ((L'-' < wVar3) && (uVar1 = Rand_div(0x41 - wVar3), uVar1 == 0)) {
      wVar2 = pick_one_chest_trap(wVar3);
      local_20 = wVar2 | local_20;
      uVar1 = Rand_div(0x28);
      if (uVar1 == 0) {
        wVar3 = pick_one_chest_trap(wVar3);
        local_20 = wVar3 | local_20;
      }
    }
    obj_local._4_4_ = local_20;
  }
  return obj_local._4_4_;
}

Assistant:

int pick_chest_traps(struct object *obj)
{
	int level = obj->kind->level;
	int trap = 0;

	/* One in ten chance of no trap */
	if (one_in_(10)) {
		return 1;
	}

	/* Pick a trap, add it */
	trap |= pick_one_chest_trap(level);

	/* Level dependent chance of a second trap (may overlap the first one) */
	if ((level > 5) && one_in_(1 + ((65 - level) / 10))) {
		trap |= pick_one_chest_trap(level);
	}

	/* Chance of a third trap for deep chests (may overlap existing traps) */
	if ((level > 45) && one_in_(65 - level)) {
		trap |= pick_one_chest_trap(level);
		/* Small chance of a fourth trap (may overlap existing traps) */
		if (one_in_(40)) {
			trap |= pick_one_chest_trap(level);
		}
	}

	return trap;
}